

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

void __thiscall
iutest::detail::
AllOfMatcher<iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>_>
::~AllOfMatcher(AllOfMatcher<iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>_>
                *this)

{
  AllOfMatcher<iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>_>
  *this_local;
  
  ~AllOfMatcher(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

class AllOfMatcher IUTEST_CXX_FINAL : public AllOfMatcherBase
{
public:
    explicit AllOfMatcher(T... t) : m_matchers(t...) {}

public:
    template<typename U>
    AssertionResult operator ()(const U& actual)
    {
        return Check(m_matchers, actual);
    }
    ::std::string WhichIs() const IUTEST_CXX_OVERRIDE
    {
        return AllOfMatcherBase::WhichIs<0>(m_matchers);
    }

private:
    tuples::tuple<T...> m_matchers;
}